

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O2

from_chars_result
absl::from_chars(Nonnull<const_char_*> first,Nonnull<const_char_*> last,double *value,
                chars_format fmt)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  bool bVar9;
  int iVar10;
  int iVar11;
  uint64_t guess_mantissa;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  uint uVar16;
  uint128 *calculated;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  Nonnull<const_char_*> begin;
  bool negative;
  double dVar20;
  uint128 other;
  uint128 value_00;
  CalculatedFloat CVar21;
  from_chars_result fVar22;
  from_chars_result result;
  char local_89;
  uint128 wide_binary_mantissa;
  ParsedFloat hex_parse;
  uint128 local_40;
  
  result.ec = 0;
  negative = false;
  begin = first;
  if (first != last) {
    negative = *first == '-';
    begin = first + negative;
  }
  result.ptr = first;
  if (((fmt & hex) == 0) && (1 < (long)last - (long)begin)) {
    if ((*begin == '0') && ((byte)(begin[1] | 0x20U) == 0x78)) {
      strings_internal::ParseFloat<16>(&hex_parse,begin + 2,last,fmt);
      if ((hex_parse.end != (char *)0x0) && (hex_parse.type == kNumber)) goto LAB_00115824;
      if (fmt != scientific) {
        result.ptr = begin + 1;
        if (negative == false) {
          dVar20 = 0.0;
        }
        else {
          dVar20 = -0.0;
        }
        *value = dVar20;
        goto LAB_00115a15;
      }
    }
    else {
LAB_001157a6:
      strings_internal::ParseFloat<10>(&hex_parse,begin,last,fmt);
      if (hex_parse.end != (char *)0x0) {
        result.ptr = hex_parse.end;
        bVar9 = anon_unknown_0::HandleEdgeCase<double>(&hex_parse,negative,value);
        if (bVar9) goto LAB_00115a15;
        if (hex_parse.subrange_begin == (char *)0x0) {
          if (hex_parse.exponent < -0x156) {
            if (negative == false) {
              dVar20 = 0.0;
            }
            else {
              dVar20 = -0.0;
            }
          }
          else {
            if (hex_parse.exponent < 0x135) {
              if (hex_parse.mantissa == 0) {
                uVar16 = 0x40;
              }
              else {
                lVar13 = 0x3f;
                if (hex_parse.mantissa != 0) {
                  for (; hex_parse.mantissa >> lVar13 == 0; lVar13 = lVar13 + -1) {
                  }
                }
                uVar16 = (uint)lVar13 ^ 0x3f;
              }
              uVar14 = hex_parse.mantissa << ((byte)uVar16 & 0x3f);
              uVar18 = (ulong)(hex_parse.exponent + 0x156);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = uVar14;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaHighTable +
                                       uVar18 * 8);
              auVar6 = auVar2 * auVar4;
              if (CARRY8(auVar6._0_8_,uVar14) && (~auVar6._8_4_ & 0x1ff) == 0) {
                auVar3._8_8_ = 0;
                auVar3._0_8_ = uVar14;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaLowTable +
                                         uVar18 * 8);
                auVar8._8_8_ = 0;
                auVar8._0_8_ = SUB168(auVar3 * auVar5,8);
                auVar6 = auVar6 + auVar8;
                if (auVar6._0_8_ == -1 && (~auVar6._8_4_ & 0x1ff) == 0) {
                  if (CARRY8(SUB168(auVar3 * auVar5,0),uVar14)) goto LAB_001158c4;
                  auVar6._8_8_ = auVar6._8_8_;
                  auVar6._0_8_ = 0xffffffffffffffff;
                }
              }
              uVar14 = auVar6._8_8_ >> (9U - (auVar6[0xf] >> 7) & 0x3f);
              uVar17 = (uint)uVar14;
              if ((auVar6._0_8_ != 0) ||
                 ((uVar17 & 3) != 1 || (auVar6 & (undefined1  [16])0x1ff) != (undefined1  [16])0x0))
              {
                uVar14 = (uVar17 & 1) + uVar14;
                lVar13 = (((long)(int)(((hex_parse.exponent * 0x3526a >> 0x10) - uVar16) + 0x43f) -
                          (auVar6._8_8_ >> 0x3f ^ 1)) + 1) - (ulong)(uVar14 >> 0x36 == 0);
                if (0xfffffffffffff801 < lVar13 - 0x7ffU) {
                  dVar15 = (double)(uVar14 >> 1 & 0xfffffffffffff | lVar13 << 0x34);
                  dVar20 = (double)((ulong)dVar15 | 0x8000000000000000);
                  if (negative == false) {
                    dVar20 = dVar15;
                  }
                  *value = dVar20;
                  goto LAB_00115a15;
                }
              }
              goto LAB_001158c4;
            }
            if (negative == false) {
              dVar20 = 1.79769313486232e+308;
            }
            else {
              dVar20 = -1.79769313486232e+308;
            }
          }
          *value = dVar20;
          result.ec = result_out_of_range;
          goto LAB_00115a15;
        }
        if (hex_parse.exponent < -0x156) {
          uVar14 = 0xfffe7961;
LAB_0011588e:
          auVar7._8_4_ = 0;
          auVar7._0_8_ = uVar14;
          auVar7 = auVar7 << 0x40;
        }
        else {
          if (0x134 < hex_parse.exponent) {
            uVar14 = 99999;
            goto LAB_0011588e;
          }
          uVar18 = (ulong)(hex_parse.exponent + 0x156);
LAB_001158c4:
          wide_binary_mantissa.lo_ = hex_parse.mantissa;
          wide_binary_mantissa.hi_ = 0;
          other.hi_ = 0;
          other.lo_ = *(ulong *)((anonymous_namespace)::kPower10MantissaHighTable + uVar18 * 8);
          uint128::operator*=(&wide_binary_mantissa,other);
          iVar19 = (hex_parse.exponent * 0x3526a >> 0x10) + -0x3f;
          if (hex_parse.subrange_begin == (char *)0x0) {
            if (0x1b < (uint)hex_parse.exponent) {
              iVar10 = anon_unknown_0::TruncateToBitWidth(0x3f,&wide_binary_mantissa);
              iVar11 = 10;
              goto LAB_001159a3;
            }
            lVar13 = 0x3f;
            if (wide_binary_mantissa.hi_ != 0) {
              for (; wide_binary_mantissa.hi_ >> lVar13 == 0; lVar13 = lVar13 + -1) {
              }
            }
            if (wide_binary_mantissa.lo_ == 0) {
              uVar16 = 0x40;
            }
            else {
              lVar1 = 0x3f;
              if (wide_binary_mantissa.lo_ != 0) {
                for (; wide_binary_mantissa.lo_ >> lVar1 == 0; lVar1 = lVar1 + -1) {
                }
              }
              uVar16 = (uint)lVar1 ^ 0x3f;
            }
            uVar17 = (uint)lVar13 ^ 0x3f;
            if (wide_binary_mantissa.hi_ == 0) {
              uVar17 = uVar16;
            }
            iVar11 = ((uint)(wide_binary_mantissa.hi_ != 0) << 6 | 0xb) - uVar17;
            bVar12 = 1;
          }
          else {
            iVar10 = anon_unknown_0::TruncateToBitWidth(0x3a,&wide_binary_mantissa);
            iVar11 = 5;
LAB_001159a3:
            iVar19 = iVar19 + iVar10;
            bVar12 = 0;
          }
          iVar10 = -0x432 - iVar19;
          if (-0x432 - iVar19 < iVar11) {
            iVar10 = iVar11;
          }
          value_00.hi_._0_4_ = iVar10;
          value_00.lo_ = wide_binary_mantissa.hi_;
          value_00.hi_._4_4_ = 0;
          guess_mantissa =
               anon_unknown_0::ShiftRightAndRound
                         ((anon_unknown_0 *)wide_binary_mantissa.lo_,value_00,(uint)bVar12,
                          SUB81(&local_89,0),(Nonnull<bool_*>)hex_parse.mantissa);
          if (local_89 == '\0') {
            bVar9 = anon_unknown_0::MustRoundUp(guess_mantissa,iVar19 + iVar10,&hex_parse);
            guess_mantissa = guess_mantissa + bVar9;
          }
          CVar21 = anon_unknown_0::CalculatedFloatFromRawValues<double>
                             (guess_mantissa,iVar19 + iVar10);
          auVar7 = CVar21._0_12_;
        }
        calculated = &local_40;
        goto LAB_00115a00;
      }
    }
LAB_00115854:
    result.ec = invalid_argument;
  }
  else {
    if ((fmt & hex) == 0) goto LAB_001157a6;
    strings_internal::ParseFloat<16>(&hex_parse,begin,last,fmt);
    if (hex_parse.end == (char *)0x0) goto LAB_00115854;
LAB_00115824:
    result.ptr = hex_parse.end;
    bVar9 = anon_unknown_0::HandleEdgeCase<double>(&hex_parse,negative,value);
    if (bVar9) goto LAB_00115a15;
    CVar21 = anon_unknown_0::CalculateFromParsedHexadecimal<double>(&hex_parse);
    auVar7 = CVar21._0_12_;
    calculated = &wide_binary_mantissa;
LAB_00115a00:
    calculated->lo_ = auVar7._0_8_;
    *(int *)&calculated->hi_ = auVar7._8_4_;
    anon_unknown_0::EncodeResult<double>((CalculatedFloat *)calculated,negative,&result,value);
  }
LAB_00115a15:
  fVar22.ec = result.ec;
  fVar22.ptr = result.ptr;
  fVar22._12_4_ = 0;
  return fVar22;
}

Assistant:

from_chars_result from_chars(absl::Nonnull<const char*> first,
                             absl::Nonnull<const char*> last, double& value,
                             chars_format fmt) {
  return FromCharsImpl(first, last, value, fmt);
}